

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O0

void __thiscall
re2c::Skeleton::generate_paths_cunit_key<unsigned_short,unsigned_short>
          (Skeleton *this,FILE *input,FILE *keys)

{
  uint32_t line;
  bool bVar1;
  undefined8 uVar2;
  string local_98;
  covers_t local_64;
  rule_t rStack_60;
  covers_t size;
  undefined1 local_58 [8];
  path_t prefix;
  FILE *keys_local;
  FILE *input_local;
  Skeleton *this_local;
  
  rStack_60 = this->nodes->rule;
  prefix.ctx_pos = (size_t)keys;
  path_t::path_t((path_t *)local_58,rStack_60,(bool)(this->nodes->ctx & 1));
  local_64.value = (uint32_t)u32lim_t<1073741824U>::from32(0);
  Node::cover<unsigned_short,unsigned_short>
            (this->nodes,(path_t *)local_58,input,(FILE *)prefix.ctx_pos,&local_64);
  bVar1 = u32lim_t<1073741824U>::overflow(&local_64);
  if (bVar1) {
    line = this->line;
    incond(&local_98,&this->cond);
    uVar2 = std::__cxx11::string::c_str();
    warning((char *)0x0,line,false,"DFA %sis too large: can only generate partial path cover",uVar2)
    ;
    std::__cxx11::string::~string((string *)&local_98);
  }
  path_t::~path_t((path_t *)local_58);
  return;
}

Assistant:

void Skeleton::generate_paths_cunit_key (FILE * input, FILE * keys)
{
	path_t prefix (nodes->rule, nodes->ctx);
	Node::covers_t size = Node::covers_t::from32(0u);

	nodes->cover<cunit_t, key_t> (prefix, input, keys, size);

	if (size.overflow ())
	{
		warning
			( NULL
			, line
			, false
			, "DFA %sis too large: can only generate partial path cover"
			, incond (cond).c_str ()
			);
	}
}